

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O0

boolean print_text_marker(j_decompress_ptr cinfo)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ushort **ppuVar4;
  long *in_RDI;
  bool bVar5;
  uint lastch;
  uint ch;
  long length;
  boolean traceit;
  uint uVar6;
  uint in_stack_ffffffffffffffe4;
  long local_18;
  
  bVar1 = 0 < *(int *)(*in_RDI + 0x7c);
  uVar6 = 0;
  uVar2 = jpeg_getc((j_decompress_ptr)((ulong)in_stack_ffffffffffffffe4 << 0x20));
  uVar3 = jpeg_getc((j_decompress_ptr)CONCAT44(in_stack_ffffffffffffffe4,uVar6));
  local_18 = (ulong)uVar3 + (ulong)(uVar2 << 8) + -2;
  if (bVar1) {
    if (*(int *)((long)in_RDI + 0x21c) == 0xfe) {
      fprintf(_stderr,"Comment, length %ld:\n",local_18);
    }
    else {
      fprintf(_stderr,"APP%d, length %ld:\n",(ulong)(*(int *)((long)in_RDI + 0x21c) - 0xe0),local_18
             );
    }
  }
  while (local_18 = local_18 + -1, -1 < local_18) {
    in_stack_ffffffffffffffe4 =
         jpeg_getc((j_decompress_ptr)CONCAT44(in_stack_ffffffffffffffe4,uVar6));
    if (bVar1) {
      if (in_stack_ffffffffffffffe4 == 0xd) {
        fprintf(_stderr,"\n");
        uVar6 = in_stack_ffffffffffffffe4;
      }
      else if (in_stack_ffffffffffffffe4 == 10) {
        bVar5 = uVar6 != 0xd;
        uVar6 = in_stack_ffffffffffffffe4;
        if (bVar5) {
          fprintf(_stderr,"\n");
          in_stack_ffffffffffffffe4 = uVar6;
        }
      }
      else if (in_stack_ffffffffffffffe4 == 0x5c) {
        fprintf(_stderr,"\\\\");
        uVar6 = in_stack_ffffffffffffffe4;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)in_stack_ffffffffffffffe4] & 0x4000) == 0) {
          fprintf(_stderr,"\\%03o",(ulong)in_stack_ffffffffffffffe4);
          uVar6 = in_stack_ffffffffffffffe4;
        }
        else {
          putc(in_stack_ffffffffffffffe4,_stderr);
          uVar6 = in_stack_ffffffffffffffe4;
        }
      }
    }
  }
  if (bVar1) {
    fprintf(_stderr,"\n");
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
print_text_marker(j_decompress_ptr cinfo)
{
  boolean traceit = (cinfo->err->trace_level >= 1);
  long length;
  unsigned int ch;
  unsigned int lastch = 0;

  length = jpeg_getc(cinfo) << 8;
  length += jpeg_getc(cinfo);
  length -= 2;                  /* discount the length word itself */

  if (traceit) {
    if (cinfo->unread_marker == JPEG_COM)
      fprintf(stderr, "Comment, length %ld:\n", (long)length);
    else                        /* assume it is an APPn otherwise */
      fprintf(stderr, "APP%d, length %ld:\n",
              cinfo->unread_marker - JPEG_APP0, (long)length);
  }

  while (--length >= 0) {
    ch = jpeg_getc(cinfo);
    if (traceit) {
      /* Emit the character in a readable form.
       * Nonprintables are converted to \nnn form,
       * while \ is converted to \\.
       * Newlines in CR, CR/LF, or LF form will be printed as one newline.
       */
      if (ch == '\r') {
        fprintf(stderr, "\n");
      } else if (ch == '\n') {
        if (lastch != '\r')
          fprintf(stderr, "\n");
      } else if (ch == '\\') {
        fprintf(stderr, "\\\\");
      } else if (isprint(ch)) {
        putc(ch, stderr);
      } else {
        fprintf(stderr, "\\%03o", ch);
      }
      lastch = ch;
    }
  }

  if (traceit)
    fprintf(stderr, "\n");

  return TRUE;
}